

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setWindowTitle_sys(QWidgetPrivate *this,QString *caption)

{
  bool bVar1;
  QWidget *obj;
  QWindow *pQVar2;
  ulong uVar3;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QAccessibleInterface *accessible;
  QWindow *window;
  QWidget *q;
  QString oldAccessibleName;
  QAccessibleEvent event;
  QString *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar4;
  long *local_a8;
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = q_func(in_RDI);
  bVar1 = QWidget::isWindow((QWidget *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)))
  ;
  if ((bVar1) &&
     (pQVar2 = QWidget::windowHandle
                         ((QWidget *)
                          CONCAT17(in_stack_ffffffffffffff57,
                                   CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50))),
     pQVar2 != (QWindow *)0x0)) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x371a47);
    uVar3 = QAccessible::isActive();
    if ((uVar3 & 1) == 0) {
      local_a8 = (long *)0x0;
    }
    else {
      local_a8 = (long *)QAccessible::queryAccessibleInterface(&obj->super_QObject);
    }
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 0x60))(local_58,local_a8,0);
      QString::operator=((QString *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                         in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x371aa9);
    }
    QWindow::setTitle((QString *)pQVar2);
    bVar4 = 0;
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 0x60))(local_70,local_a8,0);
      bVar4 = ::operator!=((QString *)
                           CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff56,
                                                   in_stack_ffffffffffffff50)),
                           in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x371b13);
    }
    if ((bVar4 & 1) != 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent
                ((QAccessibleEvent *)&local_28,&obj->super_QObject,NameChanged);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    }
    QString::~QString((QString *)0x371b94);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowTitle_sys(const QString &caption)
{
    Q_Q(QWidget);
    if (!q->isWindow())
        return;

    if (QWindow *window = q->windowHandle())
    {
#if QT_CONFIG(accessibility)
        QString oldAccessibleName;
        const QAccessibleInterface *accessible = QAccessible::isActive()
                                               ? QAccessible::queryAccessibleInterface(q)
                                               : nullptr;
        if (accessible)
            oldAccessibleName = accessible->text(QAccessible::Name);
#endif

        window->setTitle(caption);

#if QT_CONFIG(accessibility)
        if (accessible && accessible->text(QAccessible::Name) != oldAccessibleName) {
            QAccessibleEvent event(q, QAccessible::NameChanged);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}